

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Scope * new_D_Scope(D_Scope *parent)

{
  D_Scope *__s;
  D_SymHash *pDVar1;
  D_Scope *st;
  D_Scope *parent_local;
  
  __s = (D_Scope *)malloc(0x50);
  memset(__s,0,0x50);
  if (parent == (D_Scope *)0x0) {
    pDVar1 = new_D_SymHash();
    __s->hash = pDVar1;
  }
  else {
    __s->depth = parent->depth + 1;
    *(byte *)__s = *(byte *)__s & 0xfc | *(byte *)parent & 3;
    __s->search = parent;
    __s->up = parent;
    __s->up_updates = parent;
    __s->down_next = parent->down;
    parent->down = __s;
  }
  return __s;
}

Assistant:

D_Scope *new_D_Scope(D_Scope *parent) {
  D_Scope *st = MALLOC(sizeof(D_Scope));
  memset(st, 0, sizeof(D_Scope));
  if (parent) {
    st->depth = parent->depth + 1;
    st->kind = parent->kind;
    st->search = parent;
    st->up = parent;
    st->up_updates = parent;
    st->down_next = parent->down;
    parent->down = st;
  } else
    st->hash = new_D_SymHash();
  return st;
}